

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O3

void null_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                 JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  uint uVar2;
  JSAMPROW pJVar3;
  bool bVar4;
  ulong uVar5;
  JSAMPLE *pJVar6;
  ulong uVar7;
  
  if (0 < num_rows) {
    uVar1 = cinfo->image_width;
    uVar2 = cinfo->num_components;
    do {
      if (0 < (int)uVar2) {
        uVar5 = 0;
        do {
          if ((ulong)uVar1 != 0) {
            pJVar3 = output_buf[uVar5][output_row];
            pJVar6 = *input_buf + uVar5;
            uVar7 = 0;
            do {
              pJVar3[uVar7] = *pJVar6;
              uVar7 = uVar7 + 1;
              pJVar6 = pJVar6 + (int)uVar2;
            } while (uVar1 != uVar7);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar2);
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
      bVar4 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar4);
  }
  return;
}

Assistant:

METHODDEF(void)
null_convert (j_compress_ptr cinfo,
	      JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
	      JDIMENSION output_row, int num_rows)
{
  register JSAMPROW inptr;
  register JSAMPROW outptr;
  register JDIMENSION col;
  register int ci;
  int nc = cinfo->num_components;
  JDIMENSION num_cols = cinfo->image_width;

  while (--num_rows >= 0) {
    /* It seems fastest to make a separate pass for each component. */
    for (ci = 0; ci < nc; ci++) {
      inptr = *input_buf;
      outptr = output_buf[ci][output_row];
      for (col = 0; col < num_cols; col++) {
	outptr[col] = inptr[ci]; /* don't need GETJSAMPLE() here */
	inptr += nc;
      }
    }
    input_buf++;
    output_row++;
  }
}